

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.c
# Opt level: O1

int usedp(sexp lambda,sexp var,sexp x)

{
  sexp_tag_t sVar1;
  int iVar2;
  long lVar3;
  
  do {
    sVar1 = 0;
    if (((ulong)x & 3) == 0) {
      sVar1 = x->tag;
    }
    lVar3 = 0x18;
    switch(sVar1) {
    case 0x1c:
      break;
    case 0x1d:
      iVar2 = usedp(lambda,var,(x->value).type.name);
      if (iVar2 != 0) {
        return 1;
      }
      iVar2 = usedp(lambda,var,(x->value).type.cpl);
      if (iVar2 != 0) {
        return 1;
      }
      break;
    case 0x1e:
      if ((x->value).type.name != var) {
        return 0;
      }
      return (uint)((((x->value).type.cpl)->value).type.cpl == lambda);
    case 0x1f:
      lVar3 = 0x10;
      break;
    case 0x20:
      return 0;
    case 0x21:
      x = (x->value).type.name;
      goto LAB_0012e0d8;
    default:
      if (sVar1 != 6) {
        return 0;
      }
LAB_0012e0d8:
      while( true ) {
        if (((ulong)x & 3) != 0) {
          return 0;
        }
        if (x->tag != 6) break;
        iVar2 = usedp(lambda,var,(x->value).type.name);
        if (iVar2 != 0) {
          return 1;
        }
        x = (x->value).type.cpl;
      }
      return 0;
    }
    x = *(sexp *)((long)&x->tag + lVar3);
  } while( true );
}

Assistant:

static int usedp (sexp lambda, sexp var, sexp x) {
  sexp ls;
 loop:
  switch (sexp_pointerp(x) ? sexp_pointer_tag(x) : 0) {
  case SEXP_REF:
    return sexp_ref_name(x) == var && sexp_ref_loc(x) == lambda;
  case SEXP_SET:
    x = sexp_set_value(x);
    goto loop;
  case SEXP_LAMBDA:
    x = sexp_lambda_body(x);
    goto loop;
  case SEXP_CND:
    if (usedp(lambda, var, sexp_cnd_test(x))
        || usedp(lambda, var, sexp_cnd_pass(x)))
      return 1;
    x = sexp_cnd_fail(x);
    goto loop;
  case SEXP_SEQ:
    x = sexp_seq_ls(x);
  case SEXP_PAIR:
    for (ls=x; sexp_pairp(ls); ls=sexp_cdr(ls))
      if (usedp(lambda, var, sexp_car(ls)))
        return 1;
  }
  return 0;
}